

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O1

void __thiscall
ImperialTranslations_Correctness_Test::~ImperialTranslations_Correctness_Test
          (ImperialTranslations_Correctness_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImperialTranslations, Correctness)
{
    using namespace units;
    double one_m = 1;
    double one_m_in_ft = 1.0 / 0.3048;

    double one_ft_in_in = 12.0;
    double one_yd_in_ft = 3.0;
    double one_mi_in_yd = 1760.0;
    EXPECT_NEAR(convert(one_m, m, ft), one_m_in_ft, test::tolerance);
    EXPECT_NEAR(convert(ft, m), 0.3048, test::tolerance);
    EXPECT_NEAR(
        convert(one_m, precise::m, precise::ft),
        one_m_in_ft,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(precise::ft, precise::m), 0.3048, test::precise_tolerance);

    EXPECT_NEAR(convert(one_ft_in_in, in, ft), one_m, test::tolerance);
    EXPECT_NEAR(convert(one_yd_in_ft, ft, yd), one_m, test::tolerance);
    EXPECT_NEAR(convert(one_mi_in_yd, yd, mile), one_m, test::tolerance);

    EXPECT_NEAR(
        convert(mile, yd), one_mi_in_yd, test::tolerance * one_mi_in_yd);
    EXPECT_NEAR(convert(yd, foot), one_yd_in_ft, test::tolerance);
    EXPECT_NEAR(convert(ft, in), one_ft_in_in, test::tolerance);
    EXPECT_NEAR(convert(in, cm), 2.54, test::tolerance);

    EXPECT_NEAR(
        convert(precise::mile, precise::yd),
        one_mi_in_yd,
        test::precise_tolerance * one_mi_in_yd);
    EXPECT_NEAR(
        convert(precise::yd, precise::ft),
        one_yd_in_ft,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(precise::ft, precise::in),
        one_ft_in_in,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(precise::in, precise::cm), 2.54, test::precise_tolerance);
}